

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O1

void __thiscall
websocketpp::connection<websocketpp::config::asio>::handle_terminate
          (connection<websocketpp::config::asio> *this,terminate_status tstat,error_code *ec)

{
  _Atomic_word *p_Var1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  error_code *in_RCX;
  weak_ptr<void> local_98;
  weak_ptr<void> local_88;
  error_code local_78 [2];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"connection handle_terminate",(size_t)in_RCX);
  }
  if (ec->_M_value != 0) {
    log_err<std::error_code>(this,1,"handle_terminate",ec);
    in_RCX = ec;
  }
  if (tstat == closed) {
    if ((this->m_close_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      p_Var2 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        }
      }
      if ((this->m_close_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_close_handler)._M_invoker)((_Any_data *)&this->m_close_handler,&local_98);
      if (local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ->_M_weak_count;
          iVar3 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = (local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar3 + -1;
        }
        if (iVar3 == 1) {
          (*(local_98.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
    }
    log_close_result(this);
  }
  else if (tstat == failed) {
    std::error_code::error_code<websocketpp::error::value,void>(local_78,http_connection_ended);
    if ((((this->m_ec)._M_cat != local_78[0]._M_cat) ||
        ((this->m_ec)._M_value != local_78[0]._M_value)) &&
       ((this->m_fail_handler).super__Function_base._M_manager != (_Manager_type)0x0)) {
      p_Var2 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        }
      }
      if ((this->m_fail_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_fail_handler)._M_invoker)((_Any_data *)&this->m_fail_handler,&local_88);
      if (local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ->_M_weak_count;
          iVar3 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = (local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar3 + -1;
        }
        if (iVar3 == 1) {
          (*(local_88.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
    }
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x10,"Unknown terminate_status",(size_t)in_RCX);
  }
  if ((this->m_termination_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    get_shared((connection<websocketpp::config::asio> *)&stack0xffffffffffffffa8);
    if ((this->m_termination_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_termination_handler)._M_invoker)
              ((_Any_data *)&this->m_termination_handler,
               (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
               &stack0xffffffffffffffa8);
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
  }
  return;
}

Assistant:

void connection<config>::handle_terminate(terminate_status tstat,
    lib::error_code const & ec)
{
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection handle_terminate");
    }

    if (ec) {
        // there was an error actually shutting down the connection
        log_err(log::elevel::devel,"handle_terminate",ec);
    }

    // clean shutdown
    if (tstat == failed) {
        if (m_ec != error::http_connection_ended) {
            if (m_fail_handler) {
                m_fail_handler(m_connection_hdl);
            }
        }
    } else if (tstat == closed) {
        if (m_close_handler) {
            m_close_handler(m_connection_hdl);
        }
        log_close_result();
    } else {
        m_elog->write(log::elevel::rerror,"Unknown terminate_status");
    }

    // call the termination handler if it exists
    // if it exists it might (but shouldn't) refer to a bad memory location.
    // If it does, we don't care and should catch and ignore it.
    if (m_termination_handler) {
        try {
            m_termination_handler(type::get_shared());
        } catch (std::exception const & e) {
            m_elog->write(log::elevel::warn,
                std::string("termination_handler call failed. Reason was: ")+e.what());
        }
    }
}